

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

s32 __thiscall
irr::video::CNullDriver::addMaterialRenderer
          (CNullDriver *this,IMaterialRenderer *renderer,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  pointer pSVar3;
  uint uVar4;
  s32 sVar5;
  SMaterialRenderer r;
  value_type local_48;
  
  if (renderer == (IMaterialRenderer *)0x0) {
    sVar5 = -1;
  }
  else {
    paVar1 = &local_48.Name.str.field_2;
    local_48.Name.str._M_string_length = 0;
    local_48.Name.str.field_2._M_local_buf[0] = '\0';
    local_48.Name.str._M_dataplus._M_p = (pointer)paVar1;
    local_48.Renderer = renderer;
    core::string<char>::operator=(&local_48.Name,name);
    if ((name == (char *)0x0) &&
       (uVar4 = (int)((long)(this->MaterialRenderers).m_data.
                            super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->MaterialRenderers).m_data.
                            super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333, uVar4 < 5
       )) {
      core::string<char>::operator=
                (&local_48.Name,*(char **)(sBuiltInMaterialTypeNames + (ulong)(uVar4 & 7) * 8));
    }
    std::
    vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
    ::push_back(&(this->MaterialRenderers).m_data,&local_48);
    (this->MaterialRenderers).is_sorted = false;
    *(int *)(&renderer->field_0x10 + (long)renderer->_vptr_IMaterialRenderer[-3]) =
         *(int *)(&renderer->field_0x10 + (long)renderer->_vptr_IMaterialRenderer[-3]) + 1;
    pSVar2 = (this->MaterialRenderers).m_data.
             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar3 = (this->MaterialRenderers).m_data.
             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.Name.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.Name.str._M_dataplus._M_p,
                      CONCAT71(local_48.Name.str.field_2._M_allocated_capacity._1_7_,
                               local_48.Name.str.field_2._M_local_buf[0]) + 1);
    }
    sVar5 = (int)((ulong)((long)pSVar2 - (long)pSVar3) >> 3) * -0x33333333 + -1;
  }
  return sVar5;
}

Assistant:

s32 CNullDriver::addMaterialRenderer(IMaterialRenderer *renderer, const char *name)
{
	if (!renderer)
		return -1;

	SMaterialRenderer r;
	r.Renderer = renderer;
	r.Name = name;

	if (name == 0 && MaterialRenderers.size() < numBuiltInMaterials) {
		// set name of built in renderer so that we don't have to implement name
		// setting in all available renderers.
		r.Name = sBuiltInMaterialTypeNames[MaterialRenderers.size()];
	}

	MaterialRenderers.push_back(r);
	renderer->grab();

	return MaterialRenderers.size() - 1;
}